

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O1

bool __thiscall graphics101::Mesh::writeToOBJ(Mesh *this,string *path)

{
  pointer pTVar1;
  pointer pvVar2;
  pointer pvVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ostream *poVar7;
  ulong uVar8;
  ulong uVar9;
  vec<3,_float,_(glm::qualifier)0> *v;
  pointer pTVar10;
  pointer pvVar11;
  pointer pvVar12;
  pointer pTVar13;
  char *pcVar14;
  ulong uVar15;
  int iVar16;
  Triangle *face;
  pointer pTVar17;
  long lVar18;
  bool bVar19;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *__range1;
  ofstream out;
  char local_241;
  Mesh *local_240;
  undefined4 local_234;
  long local_230;
  filebuf local_228 [24];
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  pTVar13 = (this->face_normals).
            super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  pTVar1 = (this->face_normals).
           super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((pTVar13 == pTVar1) ||
     ((long)pTVar13 - (long)pTVar1 ==
      (long)(this->face_positions).
            super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(this->face_positions).
            super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
            _M_impl.super__Vector_impl_data._M_start)) {
    pTVar13 = (this->face_texcoords).
              super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    pTVar1 = (this->face_texcoords).
             super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((pTVar13 == pTVar1) ||
       ((long)pTVar13 - (long)pTVar1 ==
        (long)(this->face_positions).
              super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(this->face_positions).
              super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
              _M_impl.super__Vector_impl_data._M_start)) {
      pTVar13 = (this->face_positions).
                super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pTVar1 = (this->face_positions).
               super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      local_240 = this;
      if (pTVar13 != pTVar1) {
        uVar15 = ((long)(this->positions).
                        super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->positions).
                        super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
        bVar19 = true;
        pTVar17 = pTVar13;
        do {
          pTVar17 = pTVar17 + 1;
          uVar8 = 3;
          iVar16 = 3;
          pTVar10 = pTVar17;
          do {
            auVar4._8_8_ = 0;
            auVar4._0_8_ = uVar8;
            uVar9 = SUB168(auVar4 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 & 0xfffffffffffffffc;
            if ((*(int *)((long)pTVar10 + uVar9 * -3) < 0) ||
               (uVar9 = (ulong)*(int *)((long)pTVar10 + uVar9 * -3),
               uVar15 < uVar9 || uVar15 - uVar9 == 0)) {
              bVar19 = false;
            }
            pTVar10 = (pointer)&pTVar10->B;
            uVar8 = uVar8 + 1;
            iVar16 = iVar16 + -1;
          } while (iVar16 != 0);
          pTVar13 = pTVar13 + 1;
        } while (pTVar13 != pTVar1);
        if (!bVar19) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "WARNING: Faces for positions contain invalid indices. OBJ will contain an invalid mesh.\n"
                     ,0x58);
        }
      }
      pTVar13 = (this->face_normals).
                super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pTVar1 = (this->face_normals).
               super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (pTVar13 != pTVar1) {
        uVar15 = ((long)(this->normals).
                        super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->normals).
                        super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
        bVar19 = true;
        pTVar17 = pTVar13;
        do {
          pTVar17 = pTVar17 + 1;
          uVar8 = 3;
          iVar16 = 3;
          pTVar10 = pTVar17;
          do {
            auVar5._8_8_ = 0;
            auVar5._0_8_ = uVar8;
            uVar9 = SUB168(auVar5 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 & 0xfffffffffffffffc;
            if ((*(int *)((long)pTVar10 + uVar9 * -3) < 0) ||
               (uVar9 = (ulong)*(int *)((long)pTVar10 + uVar9 * -3),
               uVar15 < uVar9 || uVar15 - uVar9 == 0)) {
              bVar19 = false;
            }
            pTVar10 = (pointer)&pTVar10->B;
            uVar8 = uVar8 + 1;
            iVar16 = iVar16 + -1;
          } while (iVar16 != 0);
          pTVar13 = pTVar13 + 1;
        } while (pTVar13 != pTVar1);
        this = local_240;
        if (!bVar19) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "WARNING: Faces for normals contain invalid indices. OBJ will contain an invalid mesh.\n"
                     ,0x56);
        }
      }
      pTVar13 = (this->face_texcoords).
                super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pTVar1 = (this->face_texcoords).
               super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (pTVar13 != pTVar1) {
        bVar19 = true;
        pTVar17 = pTVar13;
        do {
          pTVar17 = pTVar17 + 1;
          uVar15 = 3;
          iVar16 = 3;
          pTVar10 = pTVar17;
          do {
            auVar6._8_8_ = 0;
            auVar6._0_8_ = uVar15;
            uVar8 = SUB168(auVar6 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 & 0xfffffffffffffffc;
            if ((*(int *)((long)pTVar10 + uVar8 * -3) < 0) ||
               ((ulong)((long)(local_240->texcoords).
                              super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(local_240->texcoords).
                              super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) <=
                (ulong)(long)*(int *)((long)pTVar10 + uVar8 * -3))) {
              bVar19 = false;
            }
            pTVar10 = (pointer)&pTVar10->B;
            uVar15 = uVar15 + 1;
            iVar16 = iVar16 + -1;
          } while (iVar16 != 0);
          pTVar13 = pTVar13 + 1;
        } while (pTVar13 != pTVar1);
        if (!bVar19) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "WARNING: Faces for texture coordinates contain invalid indices. OBJ will contain an invalid mesh.\n"
                     ,0x62);
        }
      }
      std::ofstream::ofstream(&local_230,(string *)path,_S_out);
      bVar19 = (abStack_210[*(long *)(local_230 + -0x18)] & 5) == 0;
      local_234 = (undefined4)CONCAT71((int7)((ulong)*(long *)(local_230 + -0x18) >> 8),bVar19);
      if (bVar19) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_230,"# OBJ written by Mesh::writeToOBJ()\n",0x24);
        *(undefined8 *)(local_228 + *(long *)(local_230 + -0x18)) = 0x20;
        local_241 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,&local_241,1);
        pvVar12 = (local_240->positions).
                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pvVar2 = (local_240->positions).
                 super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pvVar12 != pvVar2) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"v ",2);
            poVar7 = std::ostream::_M_insert<double>((double)(pvVar12->field_0).x);
            local_241 = ' ';
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_241,1);
            poVar7 = std::ostream::_M_insert<double>((double)(pvVar12->field_1).y);
            local_241 = ' ';
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_241,1);
            poVar7 = std::ostream::_M_insert<double>((double)(pvVar12->field_2).z);
            local_241 = '\n';
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_241,1);
            pvVar12 = pvVar12 + 1;
          } while (pvVar12 != pvVar2);
        }
        local_241 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,&local_241,1);
        pvVar11 = (local_240->texcoords).
                  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pvVar3 = (local_240->texcoords).
                 super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pvVar11 != pvVar3) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"vt ",3);
            poVar7 = std::ostream::_M_insert<double>((double)(pvVar11->field_0).x);
            local_241 = ' ';
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_241,1);
            poVar7 = std::ostream::_M_insert<double>((double)(pvVar11->field_1).y);
            local_241 = '\n';
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_241,1);
            pvVar11 = pvVar11 + 1;
          } while (pvVar11 != pvVar3);
        }
        local_241 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,&local_241,1);
        pvVar12 = (local_240->normals).
                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pvVar2 = (local_240->normals).
                 super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pvVar12 != pvVar2) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"vn ",3);
            poVar7 = std::ostream::_M_insert<double>((double)(pvVar12->field_0).x);
            local_241 = ' ';
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_241,1);
            poVar7 = std::ostream::_M_insert<double>((double)(pvVar12->field_1).y);
            local_241 = ' ';
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_241,1);
            poVar7 = std::ostream::_M_insert<double>((double)(pvVar12->field_2).z);
            local_241 = '\n';
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_241,1);
            pvVar12 = pvVar12 + 1;
          } while (pvVar12 != pvVar2);
        }
        local_241 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,&local_241,1);
        pTVar13 = (local_240->face_texcoords).
                  super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pTVar1 = (local_240->face_texcoords).
                 super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if ((pTVar13 == pTVar1) &&
           ((local_240->face_normals).
            super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            (local_240->face_normals).
            super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
            _M_impl.super__Vector_impl_data._M_finish)) {
          pTVar13 = (local_240->face_positions).
                    super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pTVar1 = (local_240->face_positions).
                   super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (pTVar13 != pTVar1) {
            do {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"f ",2);
              poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_230,pTVar13->A + 1);
              local_241 = ' ';
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_241,1);
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,pTVar13->B + 1);
              local_241 = ' ';
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_241,1);
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,pTVar13->C + 1);
              local_241 = '\n';
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_241,1);
              pTVar13 = pTVar13 + 1;
            } while (pTVar13 != pTVar1);
          }
        }
        else {
          pTVar17 = (local_240->face_positions).
                    super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pTVar10 = (local_240->face_positions).
                    super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if ((local_240->face_normals).
              super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
              _M_impl.super__Vector_impl_data._M_start ==
              (local_240->face_normals).
              super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            if (pTVar10 != pTVar17) {
              lVar18 = 8;
              uVar15 = 0;
              do {
                pTVar13 = (local_240->face_texcoords).
                          super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                uVar8 = ((long)(local_240->face_texcoords).
                               super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar13 >> 2) *
                        -0x5555555555555555;
                if (uVar8 < uVar15 || uVar8 - uVar15 == 0) {
                  std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,uVar15);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"f ",2);
                poVar7 = (ostream *)
                         std::ostream::operator<<
                                   ((ostream *)&local_230,*(int *)((long)pTVar17 + lVar18 + -8) + 1)
                ;
                local_241 = '/';
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_241,1);
                poVar7 = (ostream *)
                         std::ostream::operator<<(poVar7,*(int *)((long)pTVar13 + lVar18 + -8) + 1);
                local_241 = ' ';
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_241,1);
                poVar7 = (ostream *)
                         std::ostream::operator<<(poVar7,*(int *)((long)pTVar17 + lVar18 + -4) + 1);
                local_241 = '/';
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_241,1);
                poVar7 = (ostream *)
                         std::ostream::operator<<(poVar7,*(int *)((long)pTVar13 + lVar18 + -4) + 1);
                local_241 = ' ';
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_241,1);
                poVar7 = (ostream *)
                         std::ostream::operator<<(poVar7,*(int *)((long)&pTVar17->A + lVar18) + 1);
                local_241 = '/';
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_241,1);
                poVar7 = (ostream *)
                         std::ostream::operator<<(poVar7,*(int *)((long)&pTVar13->A + lVar18) + 1);
                local_241 = '\n';
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_241,1);
                uVar15 = uVar15 + 1;
                pTVar17 = (local_240->face_positions).
                          super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                uVar8 = ((long)(local_240->face_positions).
                               super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar17 >> 2) *
                        -0x5555555555555555;
                lVar18 = lVar18 + 0xc;
              } while (uVar15 <= uVar8 && uVar8 - uVar15 != 0);
            }
          }
          else if (pTVar13 == pTVar1) {
            if (pTVar10 != pTVar17) {
              lVar18 = 8;
              uVar15 = 0;
              do {
                pTVar13 = (local_240->face_normals).
                          super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                uVar8 = ((long)(local_240->face_normals).
                               super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar13 >> 2) *
                        -0x5555555555555555;
                if (uVar8 < uVar15 || uVar8 - uVar15 == 0) {
                  std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,uVar15);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"f ",2);
                poVar7 = (ostream *)
                         std::ostream::operator<<
                                   ((ostream *)&local_230,*(int *)((long)pTVar17 + lVar18 + -8) + 1)
                ;
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"//",2);
                poVar7 = (ostream *)
                         std::ostream::operator<<(poVar7,*(int *)((long)pTVar13 + lVar18 + -8) + 1);
                local_241 = ' ';
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_241,1);
                poVar7 = (ostream *)
                         std::ostream::operator<<(poVar7,*(int *)((long)pTVar17 + lVar18 + -4) + 1);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"//",2);
                poVar7 = (ostream *)
                         std::ostream::operator<<(poVar7,*(int *)((long)pTVar13 + lVar18 + -4) + 1);
                local_241 = ' ';
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_241,1);
                poVar7 = (ostream *)
                         std::ostream::operator<<(poVar7,*(int *)((long)&pTVar17->A + lVar18) + 1);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"//",2);
                poVar7 = (ostream *)
                         std::ostream::operator<<(poVar7,*(int *)((long)&pTVar13->A + lVar18) + 1);
                local_241 = '\n';
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_241,1);
                uVar15 = uVar15 + 1;
                pTVar17 = (local_240->face_positions).
                          super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                uVar8 = ((long)(local_240->face_positions).
                               super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar17 >> 2) *
                        -0x5555555555555555;
                lVar18 = lVar18 + 0xc;
              } while (uVar15 <= uVar8 && uVar8 - uVar15 != 0);
            }
          }
          else if (pTVar10 != pTVar17) {
            lVar18 = 8;
            uVar15 = 0;
            do {
              pTVar13 = (local_240->face_texcoords).
                        super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar8 = ((long)(local_240->face_texcoords).
                             super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar13 >> 2) *
                      -0x5555555555555555;
              if (uVar8 < uVar15 || uVar8 - uVar15 == 0) {
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar15);
              }
              pTVar1 = (local_240->face_normals).
                       super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar8 = ((long)(local_240->face_normals).
                             super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1 >> 2) *
                      -0x5555555555555555;
              if (uVar8 < uVar15 || uVar8 - uVar15 == 0) {
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar15);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"f ",2);
              poVar7 = (ostream *)
                       std::ostream::operator<<
                                 ((ostream *)&local_230,*(int *)((long)pTVar17 + lVar18 + -8) + 1);
              local_241 = '/';
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_241,1);
              poVar7 = (ostream *)
                       std::ostream::operator<<(poVar7,*(int *)((long)pTVar13 + lVar18 + -8) + 1);
              local_241 = '/';
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_241,1);
              poVar7 = (ostream *)
                       std::ostream::operator<<(poVar7,*(int *)((long)pTVar1 + lVar18 + -8) + 1);
              local_241 = ' ';
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_241,1);
              poVar7 = (ostream *)
                       std::ostream::operator<<(poVar7,*(int *)((long)pTVar17 + lVar18 + -4) + 1);
              local_241 = '/';
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_241,1);
              poVar7 = (ostream *)
                       std::ostream::operator<<(poVar7,*(int *)((long)pTVar13 + lVar18 + -4) + 1);
              local_241 = '/';
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_241,1);
              poVar7 = (ostream *)
                       std::ostream::operator<<(poVar7,*(int *)((long)pTVar1 + lVar18 + -4) + 1);
              local_241 = ' ';
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_241,1);
              poVar7 = (ostream *)
                       std::ostream::operator<<(poVar7,*(int *)((long)&pTVar17->A + lVar18) + 1);
              local_241 = '/';
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_241,1);
              poVar7 = (ostream *)
                       std::ostream::operator<<(poVar7,*(int *)((long)&pTVar13->A + lVar18) + 1);
              local_241 = '/';
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_241,1);
              poVar7 = (ostream *)
                       std::ostream::operator<<(poVar7,*(int *)((long)&pTVar1->A + lVar18) + 1);
              local_241 = '\n';
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_241,1);
              uVar15 = uVar15 + 1;
              pTVar17 = (local_240->face_positions).
                        super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar8 = ((long)(local_240->face_positions).
                             super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar17 >> 2) *
                      -0x5555555555555555;
              lVar18 = lVar18 + 0xc;
            } while (uVar15 <= uVar8 && uVar8 - uVar15 != 0);
          }
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"ERROR: Could not open file for writing: ",0x28);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(path->_M_dataplus)._M_p,path->_M_string_length);
        local_241 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_241,1);
      }
      local_230 = _VTT;
      *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _ws<char,std::char_traits<char>>;
      std::filebuf::~filebuf(local_228);
      std::ios_base::~ios_base(local_138);
      goto LAB_001066db;
    }
    pcVar14 = 
    "ERROR: Faces for texture coordinates don\'t match faces for positions. Can\'t write mesh to OBJ.\n"
    ;
    lVar18 = 0x5f;
  }
  else {
    pcVar14 = 
    "ERROR: Faces for normals don\'t match faces for positions. Can\'t write mesh to OBJ.\n";
    lVar18 = 0x53;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,lVar18);
  local_234 = 0;
LAB_001066db:
  return SUB41(local_234,0);
}

Assistant:

bool Mesh::writeToOBJ( const std::string& path ) {
    using namespace std;
    
    if( face_normals.size() > 0 && face_normals.size() != face_positions.size() ) {
        cerr << "ERROR: Faces for normals don't match faces for positions. Can't write mesh to OBJ.\n";
        return false;
    }
    if( face_texcoords.size() > 0 && face_texcoords.size() != face_positions.size() ) {
        cerr << "ERROR: Faces for texture coordinates don't match faces for positions. Can't write mesh to OBJ.\n";
        return false;
    }
    
    // Check for valid position indices in face_positions.
    {
        bool valid_indices = true;
        for( const auto& f : face_positions ) {
            for( int vi = 0; vi < 3; ++vi ) {
                if( f[vi] < 0 || f[vi] >= positions.size() ) {
                    valid_indices = false;
                }
            }
        }
        if( !valid_indices ) {
            cerr << "WARNING: Faces for positions contain invalid indices. OBJ will contain an invalid mesh.\n";
            // return false;
        }
    }
    // Check for valid normal indices in face_normals.
    {
        bool valid_indices = true;
        for( const auto& f : face_normals ) {
            for( int vi = 0; vi < 3; ++vi ) {
                if( f[vi] < 0 || f[vi] >= normals.size() ) {
                    valid_indices = false;
                }
            }
        }
        if( !valid_indices ) {
            cerr << "WARNING: Faces for normals contain invalid indices. OBJ will contain an invalid mesh.\n";
            // return false;
        }
    }
    // Check for valid texture coordinate indices in face_texcoords.
    {
        bool valid_indices = true;
        for( const auto& f : face_texcoords ) {
            for( int vi = 0; vi < 3; ++vi ) {
                if( f[vi] < 0 || f[vi] >= texcoords.size() ) {
                    valid_indices = false;
                }
            }
        }
        if( !valid_indices ) {
            cerr << "WARNING: Faces for texture coordinates contain invalid indices. OBJ will contain an invalid mesh.\n";
            // return false;
        }
    }
    
    // Open the file.
    ofstream out( path );
    if( !out ) {
        cerr << "ERROR: Could not open file for writing: " << path << '\n';
        return false;
    }
    
    out << "# OBJ written by Mesh::writeToOBJ()\n";
    out.precision( 32 );
    
    out << '\n';
    for( const auto& v : positions ) {
        out << "v " << v[0] << ' ' << v[1] << ' ' << v[2] << '\n';
    }
    
    out << '\n';
    for( const auto& vt : texcoords ) {
        out << "vt " << vt[0] << ' ' << vt[1] << '\n';
    }
    
    out << '\n';
    for( const auto& vn : normals ) {
        out << "vn " << vn[0] << ' ' << vn[1] << ' ' << vn[2] << '\n';
    }
    
    // OBJ's are 1-indexed, so add one to all indices.
    
    out << '\n';
    if( face_texcoords.empty() && face_normals.empty() ) {
        for( const auto& face : face_positions ) {
            out << "f " << face[0]+1 << ' ' << face[1]+1 << ' ' << face[2]+1 << '\n';
        }
    }
    else if( face_normals.empty() ) {
        for( int face_index = 0; face_index < face_positions.size(); ++face_index ) {
            const auto& p = face_positions.at(face_index);
            const auto& t = face_texcoords.at(face_index);
            out << "f "
                << p[0]+1 << '/' << t[0]+1 << ' '
                << p[1]+1 << '/' << t[1]+1 << ' '
                << p[2]+1 << '/' << t[2]+1 << '\n';
        }
    }
    else if( face_texcoords.empty() ) {
        for( int face_index = 0; face_index < face_positions.size(); ++face_index ) {
            const auto& p = face_positions.at(face_index);
            const auto& n = face_normals.at(face_index);
            out << "f "
                << p[0]+1 << "//" << n[0]+1 << ' '
                << p[1]+1 << "//" << n[1]+1 << ' '
                << p[2]+1 << "//" << n[2]+1 << '\n';
        }
    }
    else {
        for( int face_index = 0; face_index < face_positions.size(); ++face_index ) {
            const auto& p = face_positions.at(face_index);
            const auto& t = face_texcoords.at(face_index);
            const auto& n = face_normals.at(face_index);
            out << "f "
                << p[0]+1 << '/' << t[0]+1 << '/' << n[0]+1 << ' '
                << p[1]+1 << '/' << t[1]+1 << '/' << n[1]+1 << ' '
                << p[2]+1 << '/' << t[2]+1 << '/' << n[2]+1 << '\n';
        }
    }

    return true;
}